

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# irrArray.h
# Opt level: O2

void __thiscall
irr::core::array<irr::gui::CGUIEnvironment::SSpriteBank>::sort
          (array<irr::gui::CGUIEnvironment::SSpriteBank> *this)

{
  if (this->is_sorted == false) {
    ::std::
    __sort<__gnu_cxx::__normal_iterator<irr::gui::CGUIEnvironment::SSpriteBank*,std::vector<irr::gui::CGUIEnvironment::SSpriteBank,std::allocator<irr::gui::CGUIEnvironment::SSpriteBank>>>,__gnu_cxx::__ops::_Iter_less_iter>
              ((this->m_data).
               super__Vector_base<irr::gui::CGUIEnvironment::SSpriteBank,_std::allocator<irr::gui::CGUIEnvironment::SSpriteBank>_>
               ._M_impl.super__Vector_impl_data._M_start,
               (this->m_data).
               super__Vector_base<irr::gui::CGUIEnvironment::SSpriteBank,_std::allocator<irr::gui::CGUIEnvironment::SSpriteBank>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    this->is_sorted = true;
  }
  return;
}

Assistant:

void sort()
	{
		if (!is_sorted) {
			std::sort(m_data.begin(), m_data.end());
			is_sorted = true;
		}
	}